

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

void __thiscall ftxui::Color::Color(Color *this,Palette256 index)

{
  Color CVar1;
  ColorInfo CVar2;
  
  this->type_ = Palette256;
  (this->field_1).index_ = index;
  this->green_ = '\0';
  this->blue_ = '\0';
  CVar1 = Terminal::ColorSupport();
  if ((int)CVar1 < 2) {
    this->type_ = Palette16;
    CVar2 = GetColorInfo((this->field_1).index_);
    (this->field_1).index_ = CVar2.index_16;
  }
  return;
}

Assistant:

Color::Color(Palette256 index) : type_(ColorType::Palette256), index_(index) {
  if (Terminal::ColorSupport() >= Terminal::Color::Palette256)
    return;
  type_ = ColorType::Palette16;
  index_ = GetColorInfo(Color::Palette256(index_)).index_16;
}